

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O1

string * IncrString(string *__return_storage_ptr__,string *orig,long increment)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  size_t sVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char *endptr;
  char buffer [64];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  char *local_70;
  char local_68 [72];
  
  local_70 = (char *)0x0;
  lVar2 = strtol((orig->_M_dataplus)._M_p,&local_70,10);
  if (*local_70 == '\0') {
    sprintf(local_68,"%ld",lVar2 + -1);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar4 = strlen(local_68);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_68,local_68 + sVar4);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (orig->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + orig->_M_string_length);
    sprintf(local_68,"%ld",1);
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
    std::__cxx11::string::append((char *)local_b0);
    plVar3 = (long *)std::__cxx11::string::append((char *)local_b0);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_80 = *plVar5;
      lStack_78 = plVar3[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar5;
      local_90 = (long *)*plVar3;
    }
    local_88 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string IncrString(const std::string &orig, long increment)
{
	const char *nptr = orig.c_str();
	char *endptr = 0;
	long value;
	char buffer[64];

	/*
	 * Try to convert original string
	 */
	value = strtol(nptr, &endptr, 10);

	/*
	 * Did it work?
	 */
	if (*endptr == 0)
	{
		sprintf(buffer, "%ld", value + increment);
		return buffer;
	}
	else
	{
		std::string Result = orig;
		if (increment >= 0)
		{
			sprintf(buffer, "%ld", increment);
			Result = Result + " + " + buffer;
		}
		else
		{
			sprintf(buffer, "%ld", -increment);
			Result = Result + " - " + buffer;
		}
		return Result;
	}
}